

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMainParseLoop
          (MessageGenerator *this,Printer *printer,bool use_parse_context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDescriptor FVar2;
  int iVar3;
  uint uVar4;
  FieldDescriptor *descriptor;
  mapped_type *pmVar5;
  pointer ppFVar6;
  FieldGeneratorBase *pFVar7;
  undefined7 in_register_00000011;
  char *pcVar8;
  ulong uVar9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  undefined1 local_b8 [32];
  key_type local_98;
  ulong local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar8 = "input";
  if ((int)CONCAT71(in_register_00000011,use_parse_context) != 0) {
    pcVar8 = "ref input";
  }
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"maybe_ref_input","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,&local_98);
  local_68 = (ulong)use_parse_context;
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,(ulong)pcVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  io::Printer::Print<>
            (printer,"uint tag;\nwhile ((tag = input.ReadTag()) != 0) {\n  switch(tag) {\n");
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  if (this->end_tag_ != 0) {
    local_98._M_dataplus._M_p = (pointer)paVar1;
    pcVar8 = FastUInt32ToBufferLeft(this->end_tag_,paVar1->_M_local_buf);
    local_98._M_string_length = (long)pcVar8 - (long)paVar1;
    local_b8._0_8_ = (FieldDescriptor *)(local_b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    io::Printer::Print<char[8],std::__cxx11::string>
              (printer,"case $end_tag$:\n  return;\n",(char (*) [8])"end_tag",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    if ((FieldDescriptor *)local_b8._0_8_ != (FieldDescriptor *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  pcVar8 = 
  "default:\n  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n  break;\n"
  ;
  if (this->has_extension_ranges_ != false) {
    pcVar8 = 
    "default:\n  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, $maybe_ref_input$)) {\n    _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n  }\n  break;\n"
    ;
  }
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_60,pcVar8);
  ppFVar6 = (this->fields_by_number_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->fields_by_number_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar6) {
    uVar9 = 0;
    do {
      descriptor = ppFVar6[uVar9];
      if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
        local_98._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b8._0_8_ = descriptor;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)&local_98,
                   (FieldDescriptor **)local_b8);
      }
      FVar2 = descriptor[2];
      iVar3 = *(int *)(descriptor + 4);
      uVar4 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)(byte)FVar2 * 4);
      if ((~(byte)descriptor[1] & 0x60) == 0) {
        if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
          local_98._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_b8._0_8_ = descriptor;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)&local_98
                     ,(FieldDescriptor **)local_b8);
          FVar2 = descriptor[2];
        }
        if ((byte)FVar2 - 0xd < 0xfffffffc) {
          paVar1 = &local_98.field_2;
          local_98._M_dataplus._M_p = (pointer)paVar1;
          pcVar8 = FastUInt32ToBufferLeft(*(int *)(descriptor + 4) * 8 + 2,paVar1->_M_local_buf);
          local_98._M_string_length = (long)pcVar8 - (long)paVar1;
          local_b8._0_8_ = local_b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          io::Printer::Print<char[11],std::__cxx11::string>
                    (printer,"case $packed_tag$:\n",(char (*) [11])"packed_tag",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
          if ((FieldDescriptor *)local_b8._0_8_ != (FieldDescriptor *)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_);
          }
        }
      }
      paVar1 = &local_98.field_2;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      pcVar8 = FastUInt32ToBufferLeft(iVar3 << 3 | uVar4,paVar1->_M_local_buf);
      local_98._M_string_length = (long)pcVar8 - (long)paVar1;
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      io::Printer::Print<char[4],std::__cxx11::string>
                (printer,"case $tag$: {\n",(char (*) [4])0x3fd68b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      if ((FieldDescriptor *)local_b8._0_8_ != (FieldDescriptor *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_);
      }
      io::Printer::Indent(printer);
      pFVar7 = CreateFieldGeneratorInternal(this,descriptor);
      (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[9])(pFVar7,printer,local_68);
      io::Printer::Print<>(printer,"break;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"}\n");
      (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar7);
      uVar9 = uVar9 + 1;
      ppFVar6 = (this->fields_by_number_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->fields_by_number_).
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >> 3))
    ;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void MessageGenerator::GenerateMainParseLoop(io::Printer* printer, bool use_parse_context) {
  std::map<std::string, std::string> vars;
  vars["maybe_ref_input"] = use_parse_context ? "ref input" : "input";

  printer->Print(
    "uint tag;\n"
    "while ((tag = input.ReadTag()) != 0) {\n"
    "  switch(tag) {\n");
  printer->Indent();
  printer->Indent();
  if (end_tag_ != 0) {
    printer->Print(
        "case $end_tag$:\n"
        "  return;\n",
        "end_tag", StrCat(end_tag_));
  }
  if (has_extension_ranges_) {
    printer->Print(vars,
      "default:\n"
      "  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, $maybe_ref_input$)) {\n"
      "    _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n"
      "  }\n"
      "  break;\n");
  } else {
    printer->Print(vars,
      "default:\n"
      "  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n"
      "  break;\n");
  }
  for (int i = 0; i < fields_by_number().size(); i++) {
    const FieldDescriptor* field = fields_by_number()[i];
    internal::WireFormatLite::WireType wt =
        internal::WireFormat::WireTypeForFieldType(field->type());
    uint32 tag = internal::WireFormatLite::MakeTag(field->number(), wt);
    // Handle both packed and unpacked repeated fields with the same Read*Array call;
    // the two generated cases are the packed and unpacked tags.
    // TODO(jonskeet): Check that is_packable is equivalent to
    // is_repeated && wt in { VARINT, FIXED32, FIXED64 }.
    // It looks like it is...
    if (field->is_packable()) {
      printer->Print(
        "case $packed_tag$:\n",
        "packed_tag",
        StrCat(
            internal::WireFormatLite::MakeTag(
                field->number(),
                internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED)));
    }

    printer->Print("case $tag$: {\n", "tag", StrCat(tag));
    printer->Indent();
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(field));
    generator->GenerateParsingCode(printer, use_parse_context);
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Outdent();
  printer->Print("}\n"); // switch
  printer->Outdent();
  printer->Print("}\n"); // while
}